

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

insert_return_type * __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
::insert(insert_return_type *__return_storage_ptr__,
        raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
        *this,node_type *node,size_t hashval)

{
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
  res;
  size_t local_60;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
  local_58;
  _Head_base<0UL,_const_int_&,_false> local_40;
  _Head_base<0UL,_const_int_&,_false> local_38;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *local_30;
  aligned_storage_t<sizeof(slot_type),_alignof(slot_type)> *local_28;
  size_t *local_20;
  
  if ((node->
      super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
      ).alloc_.super__Optional_base<std::allocator<std::pair<const_int,_int>_>,_false,_false>.
      _M_payload.
      super__Optional_payload<std::allocator<std::pair<const_int,_int>_>,_true,_false,_false>.
      super__Optional_payload_base<std::allocator<std::pair<const_int,_int>_>_>._M_engaged == false)
  {
    (__return_storage_ptr__->position).ctrl_ = this->ctrl_ + this->capacity_;
    __return_storage_ptr__->inserted = false;
  }
  else {
    local_40._M_head_impl =
         (int *)&(node->
                 super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
                 ).slot_space_;
    local_20 = &local_60;
    local_38._M_head_impl =
         (int *)((node->
                 super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
                 ).slot_space_.data + 4);
    local_60 = hashval;
    local_30 = this;
    local_28 = (aligned_storage_t<sizeof(slot_type),_alignof(slot_type)> *)local_40._M_head_impl;
    raw_hash_set<phmap::priv::FlatHashMapPolicy<int,int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>>
    ::InsertSlotWithHash<false>::operator()
              (&local_58,&local_30,local_40._M_head_impl,
               (piecewise_construct_t *)&std::piecewise_construct,(tuple<const_int_&> *)&local_40,
               (tuple<const_int_&> *)&local_38);
    if (local_58.second != true) {
      (__return_storage_ptr__->position).ctrl_ = local_58.first.ctrl_;
      (__return_storage_ptr__->position).field_1 = local_58.first.field_1;
      __return_storage_ptr__->inserted = false;
      *(bool *)((long)&(__return_storage_ptr__->node).
                       super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
                       .alloc_.
                       super__Optional_base<std::allocator<std::pair<const_int,_int>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::allocator<std::pair<const_int,_int>_>,_true,_false,_false>
                       .super__Optional_payload_base<std::allocator<std::pair<const_int,_int>_>_> +
               1) = false;
      node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
      ::operator=(&(__return_storage_ptr__->node).
                   super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
                  ,&node->
                    super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
                 );
      return __return_storage_ptr__;
    }
    if ((node->
        super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
        ).alloc_.super__Optional_base<std::allocator<std::pair<const_int,_int>_>,_false,_false>.
        _M_payload.
        super__Optional_payload<std::allocator<std::pair<const_int,_int>_>,_true,_false,_false>.
        super__Optional_payload_base<std::allocator<std::pair<const_int,_int>_>_>._M_engaged ==
        false) {
      __assert_fail("alloc_.has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                    ,0xb04,
                    "void phmap::priv::node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int, int>>, std::allocator<std::pair<const int, int>>>::reset() [PolicyTraits = phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int, int>>, Alloc = std::allocator<std::pair<const int, int>>]"
                   );
    }
    (node->
    super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
    ).alloc_.super__Optional_base<std::allocator<std::pair<const_int,_int>_>,_false,_false>.
    _M_payload.
    super__Optional_payload<std::allocator<std::pair<const_int,_int>_>,_true,_false,_false>.
    super__Optional_payload_base<std::allocator<std::pair<const_int,_int>_>_>._M_engaged = false;
    (__return_storage_ptr__->position).ctrl_ = local_58.first.ctrl_;
    (__return_storage_ptr__->position).field_1 = local_58.first.field_1;
    __return_storage_ptr__->inserted = true;
  }
  *(bool *)((long)&(__return_storage_ptr__->node).
                   super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
                   .alloc_.
                   super__Optional_base<std::allocator<std::pair<const_int,_int>_>,_false,_false>.
                   _M_payload.
                   super__Optional_payload<std::allocator<std::pair<const_int,_int>_>,_true,_false,_false>
                   .super__Optional_payload_base<std::allocator<std::pair<const_int,_int>_>_> + 1) =
       false;
  return __return_storage_ptr__;
}

Assistant:

insert_return_type insert(node_type&& node, size_t hashval) {
        if (!node) return {end(), false, node_type()};
        const auto& elem = PolicyTraits::element(CommonAccess::GetSlot(node));
        auto res = PolicyTraits::apply(
            InsertSlotWithHash<false>{*this, std::move(*CommonAccess::GetSlot(node)), hashval},
            elem);
        if (res.second) {
            CommonAccess::Reset(&node);
            return {res.first, true, node_type()};
        } else {
            return {res.first, false, std::move(node)};
        }
    }